

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

void libtorrent::add_files
               (file_storage *fs,string *file,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *p,create_flags_t flags)

{
  undefined4 in_register_0000000c;
  string_view f;
  string local_88;
  string local_68;
  string local_48;
  
  f._M_str._4_4_ = in_register_0000000c;
  f._M_str._0_4_ = flags.m_val;
  f._M_len = (size_t)(file->_M_dataplus)._M_p;
  complete_abi_cxx11_(&local_48,(libtorrent *)file->_M_string_length,f);
  parent_path(&local_68,&local_48);
  filename(&local_88,file);
  anon_unknown_40::add_files_impl(fs,&local_68,&local_88,p,flags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add_files(file_storage& fs, std::string const& file
		, std::function<bool(std::string)> p, create_flags_t const flags)
	{
		add_files_impl(fs, parent_path(complete(file)), filename(file), p, flags);
	}